

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O1

int __thiscall QAccessibleMenu::indexOfChild(QAccessibleMenu *this,QAccessibleInterface *child)

{
  undefined1 *puVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  QWidget *this_00;
  int iVar5;
  QList<QAction_*> *pQVar6;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  QList<QAction_*> local_38;
  long local_20;
  
  pQVar6 = &local_38;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (**(code **)(*(long *)child + 0x78))(child);
  iVar5 = -1;
  if ((iVar3 != 0x15) && (iVar3 != 0xc)) goto LAB_00522df2;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  lVar4 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  if (lVar4 == 0) goto LAB_00522df2;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  QWidget::actions(&local_38,this_00);
  (**(code **)(*(long *)child + 0x18))(child);
  lVar4 = QMetaObject::cast((QObject *)&QAction::staticMetaObject);
  if (local_38.d.size == 0) {
LAB_00522dca:
    iVar5 = -1;
  }
  else {
    puVar7 = (undefined1 *)0xfffffffffffffff8;
    do {
      iVar5 = (int)pQVar6;
      puVar1 = puVar7 + local_38.d.size * -8;
      if (puVar1 == (undefined1 *)0xfffffffffffffff8) goto LAB_00522dc4;
      pQVar6 = (QList<QAction_*> *)(puVar7 + 8);
      plVar2 = (long *)((long)(local_38.d.ptr + 1) + (long)puVar7);
      puVar7 = (undefined1 *)pQVar6;
    } while (*plVar2 != lVar4);
    iVar5 = (int)((long)pQVar6 >> 3);
LAB_00522dc4:
    if (puVar1 == (undefined1 *)0xfffffffffffffff8) goto LAB_00522dca;
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
    }
  }
LAB_00522df2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMenu::indexOfChild( const QAccessibleInterface *child) const
{
    QAccessible::Role r = child->role();
    if ((r == QAccessible::MenuItem || r == QAccessible::Separator) && menu()) {
        return menu()->actions().indexOf(qobject_cast<QAction*>(child->object()));
    }
    return -1;
}